

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

uint __thiscall ON_OutlineFigure::GetUpToFourPointsOnFigure(ON_OutlineFigure *this,ON_2fPoint *p)

{
  bool bVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ON_2fPoint candidate_p;
  ON_2fPoint prev_p;
  ON_2fPoint p0;
  uint local_64;
  ON_2fPoint local_60;
  ON_2fPoint local_58;
  ON_2fPoint *local_50;
  ulong local_48;
  ulong local_40;
  ON_2fPoint local_38;
  
  if (p == (ON_2fPoint *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = 0;
    OVar3 = Internal_FigureEndDex(this,false);
    if (OVar3 != 0) {
      local_58 = ((this->m_points).m_a)->m_point;
      *p = local_58;
      uVar5 = OVar3 >> 1;
      local_64 = 1;
      local_38 = local_58;
      if (uVar5 - 1 != 0 && 3 < OVar3) {
        uVar7 = (ulong)(uVar5 - 1);
        lVar8 = uVar7 * 0xc;
        local_64 = 1;
        do {
          uVar7 = uVar7 - 1;
          bVar1 = ON_OutlineFigurePoint::IsOnFigure
                            ((ON_OutlineFigurePoint *)
                             (&((this->m_points).m_a)->m_point_type + lVar8));
          if (bVar1) {
            local_60 = *(ON_2fPoint *)((long)&(((this->m_points).m_a)->m_point).x + lVar8);
            bVar1 = ON_2fPoint::operator!=(&local_58,&local_60);
            if (bVar1) {
              local_58 = local_60;
              local_64 = 2;
              p[1] = local_60;
              break;
            }
          }
          lVar8 = lVar8 + -0xc;
        } while ((int)uVar7 != 0);
      }
      local_40 = (ulong)OVar3;
      local_50 = (ON_2fPoint *)CONCAT44(local_50._4_4_,OVar3 + 1);
      lVar8 = (ulong)uVar5 * 0xc;
      iVar6 = 0;
      local_48 = (ulong)uVar5;
      do {
        bVar1 = ON_OutlineFigurePoint::IsOnFigure
                          ((ON_OutlineFigurePoint *)(&((this->m_points).m_a)->m_point_type + lVar8))
        ;
        if (bVar1) {
          local_60 = *(ON_2fPoint *)((long)&(((this->m_points).m_a)->m_point).x + lVar8);
          bVar1 = ON_2fPoint::operator!=(&local_58,&local_60);
          if (bVar1) {
            local_58 = local_60;
            uVar7 = (ulong)local_64;
            local_64 = local_64 + 1;
            p[uVar7] = local_60;
            uVar5 = (int)local_48 - iVar6;
            goto LAB_0049515a;
          }
        }
        iVar6 = iVar6 + -1;
        lVar8 = lVar8 + 0xc;
      } while (~OVar3 + uVar5 != iVar6);
      uVar5 = (uint)local_50;
LAB_0049515a:
      if (uVar5 < OVar3) {
        lVar8 = local_40 * 0xc;
        local_50 = p;
        do {
          bVar1 = ON_OutlineFigurePoint::IsOnFigure
                            ((ON_OutlineFigurePoint *)
                             (&((this->m_points).m_a)->m_point_type + lVar8));
          if (bVar1) {
            local_60 = *(ON_2fPoint *)((long)&(((this->m_points).m_a)->m_point).x + lVar8);
            bVar2 = ON_2fPoint::operator!=(&local_58,&local_60);
            bVar1 = true;
            if ((bVar2) && (bVar2 = ON_2fPoint::operator!=(&local_38,&local_60), bVar2)) {
              uVar7 = (ulong)local_64;
              local_64 = local_64 + 1;
              local_50[uVar7] = local_60;
              bVar1 = false;
            }
            p = local_50;
            if (!bVar1) break;
          }
          lVar8 = lVar8 + -0xc;
          OVar3 = OVar3 - 1;
          p = local_50;
        } while (uVar5 < OVar3);
      }
    }
    if (local_64 < 4) {
      uVar7 = (ulong)local_64;
      do {
        uVar4 = uVar7 + 1;
        p[uVar7] = ON_2fPoint::NanPoint;
        uVar7 = uVar4;
      } while ((int)uVar4 != 4);
    }
  }
  return local_64;
}

Assistant:

unsigned ON_OutlineFigure::GetUpToFourPointsOnFigure(ON_2fPoint p[4]) const
{
  if (nullptr == p)
    return 0;
  
  unsigned point_count = 0;
  const ON__UINT32 end_dex = Internal_FigureEndDex(false);
  if (end_dex > 0)
  {
    // p[0] = point at the start
    const ON_2fPoint p0 = this->m_points[0].m_point;
    p[point_count++] = p0;


    // p[1] = point between start and middle
    ON_2fPoint prev_p = p0;
    unsigned i1 = end_dex / 2;
    if (i1 >= 2)
    {
      for (ON__UINT32 i = i1 - 1; i > 0; --i)
      {
        if (false == this->m_points[i].IsOnFigure())
          continue;
        const ON_2fPoint candidate_p = this->m_points[i].m_point;
        if (prev_p != candidate_p)
        {
          prev_p = candidate_p;
          p[point_count++] = candidate_p;
          break;
        }
      }
    }

    // p[2] = point between middle and end
    for (/*empty init*/; i1 <= end_dex; ++i1)
    {
      if (false == this->m_points[i1].IsOnFigure())
        continue;
      const ON_2fPoint candidate_p = this->m_points[i1].m_point;
      if (prev_p != candidate_p)
      {
        prev_p = candidate_p;
        p[point_count++] = candidate_p;
        break;
      }
    }

    // p[3] = point close to end
    for (ON__UINT32 i = end_dex; i > i1; --i)
    {
      if (false == this->m_points[i].IsOnFigure())
        continue;
      const ON_2fPoint candidate_p = this->m_points[i].m_point;
      if (prev_p != candidate_p && p0 != candidate_p)
      {
        p[point_count++] = candidate_p;
        break;
      }
    }
  }

  for (unsigned i = point_count; i < 4; ++i)
    p[i] = ON_2fPoint::NanPoint;
  return point_count;
}